

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Vec_Int_t * Abc_NtkFanoutCounts(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vFanNums;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_IntAlloc(0);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFill(p,iVar1,-1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_24);
    if ((pObj_00 != (Abc_Obj_t *)0x0) &&
       ((iVar1 = Abc_ObjIsCi(pObj_00), iVar1 != 0 || (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0))))
    {
      iVar1 = Abc_ObjFanoutNum(pObj_00);
      Vec_IntWriteEntry(p,local_24,iVar1);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFanoutCounts( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vFanNums;
    Abc_Obj_t * pObj;
    int i;
    vFanNums = Vec_IntAlloc( 0 );
    Vec_IntFill( vFanNums, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) )
            Vec_IntWriteEntry( vFanNums, i, Abc_ObjFanoutNum(pObj) );
    return vFanNums;
}